

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

real __thiscall fasttext::Model::binaryLogistic(Model *this,int32_t target,bool label,real lr)

{
  undefined1 in_DL;
  undefined4 in_ESI;
  Matrix *in_RDI;
  float in_XMM0_Da;
  real rVar1;
  double dVar2;
  undefined1 auVar3 [16];
  real alpha;
  real score;
  float a;
  undefined4 in_stack_ffffffffffffffe0;
  undefined3 in_stack_ffffffffffffffe8;
  uint uVar4;
  Matrix *this_00;
  undefined4 local_4;
  
  uVar4 = CONCAT13(in_DL,in_stack_ffffffffffffffe8) & 0x1ffffff;
  this_00 = in_RDI;
  std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16158e);
  rVar1 = Matrix::dotRow(this_00,(Vector *)CONCAT44(in_ESI,uVar4),
                         CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe0));
  rVar1 = utils::sigmoid(rVar1);
  a = in_XMM0_Da * ((float)((byte)(uVar4 >> 0x18) & 1) - rVar1);
  std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_RDI);
  Vector::addRow((Vector *)this_00,(Matrix *)CONCAT44(in_ESI,uVar4),CONCAT44(in_XMM0_Da,rVar1),a);
  std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x161610);
  Matrix::addRow(this_00,(Vector *)CONCAT44(in_ESI,uVar4),CONCAT44(in_XMM0_Da,rVar1),a);
  if ((uVar4 & 0x1000000) == 0) {
    auVar3._4_12_ = SUB1612(ZEXT816(0x3ff0000000000000),4);
    auVar3._0_4_ = 1.0 - rVar1;
    dVar2 = utils::log(auVar3._0_8_);
    local_4 = SUB84(dVar2,0);
  }
  else {
    dVar2 = utils::log((double)(ulong)(uint)rVar1);
    local_4 = SUB84(dVar2,0);
  }
  local_4 = -local_4;
  return local_4;
}

Assistant:

real Model::binaryLogistic(int32_t target, bool label, real lr) {
  real score = utils::sigmoid(wo_->dotRow(hidden_, target));
  real alpha = lr * (real(label) - score);
  grad_.addRow(*wo_, target, alpha);
  wo_->addRow(hidden_, target, alpha);
  if (label) {
    return -utils::log(score);
  } else {
    return -utils::log(1.0 - score);
  }
}